

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# post.hpp
# Opt level: O1

void __thiscall
asio::detail::initiate_post_with_executor<asio::any_io_executor>::operator()
          (initiate_post_with_executor<asio::any_io_executor> *this,
          binder1<asio::detail::iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>,_std::error_code>
          *handler,type *param_2,type *param_3)

{
  _Head_base<2UL,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_false>
  *p_Var1;
  allocator_t<std::allocator<void>_> local_129;
  type local_128;
  binder0<asio::detail::binder1<asio::detail::iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>,_std::error_code>_>
  local_f0;
  type local_48;
  
  asio_require_fn::impl::operator()
            (&local_48,(impl *)&asio_require_fn::static_instance<asio_require_fn::impl>::instance,
             &this->ex_,(never_t<0> *)&execution::detail::blocking_t<0>::never);
  asio_prefer_fn::impl::operator()
            (&local_128,(impl *)&asio_prefer_fn::static_instance<asio_prefer_fn::impl>::instance,
             &local_48,(fork_t<0> *)&execution::detail::relationship_t<0>::fork,&local_129);
  iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>
  ::iterator_connect_op
            ((iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>
              *)&local_f0,&handler->handler_);
  local_f0.handler_.arg1_._M_value = (handler->arg1_)._M_value;
  local_f0.handler_.arg1_._4_4_ = *(undefined4 *)&(handler->arg1_).field_0x4;
  local_f0.handler_.arg1_._M_cat = (handler->arg1_)._M_cat;
  execution::detail::any_executor_base::
  execute<asio::detail::binder0<asio::detail::binder1<asio::detail::iterator_connect_op<asio::ip::tcp,asio::any_io_executor,asio::ip::basic_resolver_iterator<asio::ip::tcp>,asio::detail::default_connect_condition,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code,asio::ip::basic_resolver_iterator<asio::ip::tcp>)>>,std::error_code>>>
            ((any_executor_base *)&local_128,&local_f0);
  if (local_f0.handler_.handler_.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .super__Head_base<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_false>._M_head_impl.
      super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.handler_.handler_.handler_._M_bound_args.
               super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>_>
               .super__Head_base<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_false>._M_head_impl.
               super___shared_ptr<nuraft::asio_rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_f0.handler_.handler_.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .super__Head_base<1UL,_std::shared_ptr<nuraft::req_msg>,_false>._M_head_impl.
      super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.handler_.handler_.handler_._M_bound_args.
               super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>_>
               .
               super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>_>
               .super__Head_base<1UL,_std::shared_ptr<nuraft::req_msg>,_false>._M_head_impl.
               super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_f0.handler_.handler_.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Tuple_impl<2UL,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Head_base<2UL,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_false>
      ._M_head_impl.super__Function_base._M_manager != (_Manager_type)0x0) {
    p_Var1 = &local_f0.handler_.handler_.handler_._M_bound_args.
              super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>_>
              .
              super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>_>
              .
              super__Tuple_impl<2UL,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>_>
              .
              super__Head_base<2UL,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_false>
    ;
    (*local_f0.handler_.handler_.handler_._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Tuple_impl<2UL,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      .
      super__Head_base<2UL,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_false>
      ._M_head_impl.super__Function_base._M_manager)
              ((_Any_data *)p_Var1,(_Any_data *)p_Var1,__destroy_functor);
  }
  if (local_f0.handler_.handler_.end_.values_.
      super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.handler_.handler_.end_.values_.
               super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_f0.handler_.handler_.iter_.values_.
      super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.handler_.handler_.iter_.values_.
               super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  (*(local_128.
     super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
     .super_any_executor_base.object_fns_)->destroy)((any_executor_base *)&local_128);
  (*(local_48.
     super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
     .super_any_executor_base.object_fns_)->destroy)((any_executor_base *)&local_48);
  return;
}

Assistant:

void operator()(ASIO_MOVE_ARG(CompletionHandler) handler,
      typename enable_if<
        execution::is_executor<
          typename conditional<true, executor_type, CompletionHandler>::type
        >::value
      >::type* = 0,
      typename enable_if<
        !detail::is_work_dispatcher_required<
          typename decay<CompletionHandler>::type,
          Executor
        >::value
      >::type* = 0) const
  {
    typedef typename decay<CompletionHandler>::type handler_t;

    typename associated_allocator<handler_t>::type alloc(
        (get_associated_allocator)(handler));

    execution::execute(
        asio::prefer(
          asio::require(ex_, execution::blocking.never),
          execution::relationship.fork,
          execution::allocator(alloc)),
        asio::detail::bind_handler(
          ASIO_MOVE_CAST(CompletionHandler)(handler)));
  }